

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

int Ivy_ManCleanup(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pObj;
  int local_1c;
  int nNodesOld;
  int i;
  Ivy_Obj_t *pNode;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ManNodeNum(p);
  for (local_1c = 0; iVar2 = Vec_PtrSize(p->vObjs), local_1c < iVar2; local_1c = local_1c + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if (((pObj != (Ivy_Obj_t *)0x0) &&
        (((iVar2 = Ivy_ObjIsNode(pObj), iVar2 != 0 || (iVar2 = Ivy_ObjIsLatch(pObj), iVar2 != 0)) ||
         (iVar2 = Ivy_ObjIsBuf(pObj), iVar2 != 0)))) && (iVar2 = Ivy_ObjRefs(pObj), iVar2 == 0)) {
      Ivy_ObjDelete_rec(p,pObj,1);
    }
  }
  iVar2 = Ivy_ManNodeNum(p);
  return iVar1 - iVar2;
}

Assistant:

int Ivy_ManCleanup( Ivy_Man_t * p )
{
    Ivy_Obj_t * pNode;
    int i, nNodesOld;
    nNodesOld = Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pNode, i )
        if ( Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) )
            if ( Ivy_ObjRefs(pNode) == 0 )
                Ivy_ObjDelete_rec( p, pNode, 1 );
//printf( "Cleanup removed %d nodes.\n", nNodesOld - Ivy_ManNodeNum(p) );
    return nNodesOld - Ivy_ManNodeNum(p);
}